

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O2

SumNum __thiscall
Instance::sumnumprimalinfeasibilities(Instance *this,QpVector *x,QpVector *rowactivity)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  SumNum SVar7;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->num_con;
  if (this->num_con < 1) {
    uVar3 = uVar4;
  }
  dVar5 = 0.0;
  uVar2 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = (rowactivity->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar6 = (this->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if (dVar6 <= dVar1) {
      dVar6 = (this->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if (dVar6 < dVar1) {
        dVar6 = dVar1 - dVar6;
        goto LAB_0032708f;
      }
    }
    else {
      dVar6 = dVar6 - dVar1;
LAB_0032708f:
      dVar5 = dVar5 + dVar6;
      uVar2 = (ulong)((int)uVar2 + 1);
    }
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->num_var;
  if (this->num_var < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      SVar7._8_8_ = uVar2;
      SVar7.sum = dVar5;
      return SVar7;
    }
    dVar1 = (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar6 = (this->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if (dVar6 <= dVar1) {
      dVar6 = (this->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if (dVar6 < dVar1) {
        dVar6 = dVar1 - dVar6;
        goto LAB_003270e9;
      }
    }
    else {
      dVar6 = dVar6 - dVar1;
LAB_003270e9:
      dVar5 = dVar5 + dVar6;
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

SumNum sumnumprimalinfeasibilities(const QpVector& x,
                                     const QpVector& rowactivity) {
    SumNum res;
    for (HighsInt row = 0; row < num_con; row++) {
      if (rowactivity.value[row] < con_lo[row]) {
        res.sum += (con_lo[row] - rowactivity.value[row]);
        res.num++;
      } else if (rowactivity.value[row] > con_up[row]) {
        res.sum += (rowactivity.value[row] - con_up[row]);
        res.num++;
      }
    }
    for (HighsInt var = 0; var < num_var; var++) {
      if (x.value[var] < var_lo[var]) {
        res.sum += (var_lo[var] - x.value[var]);
        res.num++;
      } else if (x.value[var] > var_up[var]) {
        res.sum += (x.value[var] - var_up[var]);
        res.num++;
      }
    }
    return res;
  }